

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

lua_Number luaL_optnumber(lua_State *L,int idx,lua_Number def)

{
  uint uVar1;
  StrScanFmt SVar2;
  TValue *pTVar3;
  TValue tmp;
  TValue local_18;
  
  pTVar3 = index2adr(L,idx);
  uVar1 = (pTVar3->field_2).it;
  if (uVar1 < 0xffff0000) {
    def = (lua_Number)pTVar3->u64;
  }
  else if (((short)uVar1 != -1) &&
          (((uVar1 & 0xffff) != 0xfffb ||
           (SVar2 = lj_strscan_scan((uint8_t *)((ulong)(pTVar3->u32).lo + 0x10),&local_18,2),
           def = local_18.n, SVar2 == STRSCAN_ERROR)))) {
    lj_err_argt(L,idx,3);
  }
  return def;
}

Assistant:

LUALIB_API lua_Number luaL_optnumber(lua_State *L, int idx, lua_Number def)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o)))
    return numberVnum(o);
  else if (tvisnil(o))
    return def;
  else if (!(tvisstr(o) && lj_strscan_num(strV(o), &tmp)))
    lj_err_argt(L, idx, LUA_TNUMBER);
  return numV(&tmp);
}